

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase355::run(TestCase355 *this)

{
  PromiseBase node;
  int iVar1;
  WeakFulfiller<int> *pWVar2;
  PromiseFulfillerPair<int> pair;
  DebugExpression<bool> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  PromiseBase local_130;
  WeakFulfillerBase *local_128;
  WeakFulfiller<int> *local_120;
  int local_114;
  DebugComparison<int,_int> local_110;
  EventLoop *local_f0;
  undefined4 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  __pid_t local_cc;
  char *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  EventLoop local_98;
  
  EventLoop::EventLoop(&local_98);
  local_e8 = 0xffffffff;
  local_e0 = 0;
  uStack_d8 = 0;
  local_f0 = &local_98;
  EventLoop::enterScope(&local_98);
  pWVar2 = (WeakFulfiller<int> *)operator_new(0x18);
  (pWVar2->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar2->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006298a8;
  (pWVar2->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006298e0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<int>&>
            ((PromiseDisposer *)&local_110,pWVar2);
  local_130.node.ptr._4_4_ = local_110.right;
  local_130.node.ptr._0_4_ = local_110.left;
  local_128 = &pWVar2->super_WeakFulfillerBase;
  local_120 = pWVar2;
  iVar1 = (*(pWVar2->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector[1])
                    (pWVar2);
  local_110.left = CONCAT31(local_110.left._1_3_,(char)iVar1);
  if (kj::_::Debug::minSeverity < 3 && (char)iVar1 == '\0') {
    kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x169,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\", _kjCondition",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()",
               (DebugExpression<bool> *)&local_110);
  }
  local_110.left = 0x7b;
  (*(local_120->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector[2])();
  iVar1 = (*(local_120->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector[1])
                    ();
  local_110.left = CONCAT31(local_110.left._1_3_,(byte)iVar1) ^ 1;
  if (((byte)iVar1 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x16b,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\", _kjCondition"
               ,(char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())",
               (DebugExpression<bool> *)&local_110);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_a8 = "run";
  local_a0 = 0x2e0000016d;
  local_110.right = Promise<int>::wait((Promise<int> *)&local_130,&local_f0);
  local_110.left = 0x7b;
  local_110.op.content.ptr = " == ";
  local_110.op.content.size_ = 5;
  local_110.result = local_110.right == 0x7b;
  if ((!local_110.result) && (kj::_::Debug::minSeverity < 3)) {
    local_114 = 0x7b;
    local_c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_c0 = "run";
    local_b8 = 0x2e0000016d;
    local_cc = Promise<int>::wait((Promise<int> *)&local_130,&local_f0);
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x16d,ERROR,
               "\"failed: expected \" \"(123) == (pair.promise.wait(waitScope))\", _kjCondition, 123, pair.promise.wait(waitScope)"
               ,(char (*) [57])"failed: expected (123) == (pair.promise.wait(waitScope))",&local_110
               ,&local_114,&local_cc);
  }
  pWVar2 = local_120;
  if (local_120 != (WeakFulfiller<int> *)0x0) {
    local_120 = (WeakFulfiller<int> *)0x0;
    (**(local_128->super_Disposer)._vptr_Disposer)
              (local_128,
               (pWVar2->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector[-2]
               + (long)&(pWVar2->super_PromiseFulfiller<int>).super_PromiseRejector.
                        _vptr_PromiseRejector);
  }
  node.node.ptr = local_130.node.ptr;
  if (local_130.node.ptr != (PromiseNode *)0x0) {
    local_130.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  if (local_e0 == 0) {
    EventLoop::leaveScope(local_f0);
  }
  EventLoop::~EventLoop(&local_98);
  return;
}

Assistant:

TEST(Async, SeparateFulfiller) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(123);
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}